

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_list::apply_ip_filter
          (peer_list *this,ip_filter *filter,torrent_state *state,
          vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *banned)

{
  peer_connection_interface *ppVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  difference_type dVar5;
  size_type sVar6;
  undefined4 extraout_var;
  size_type sVar8;
  int __type;
  _Self local_d8;
  _Self local_b8;
  ip_filter *local_90;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *local_88;
  torrent_state *local_80;
  _Self local_78;
  iterator local_50;
  short *psVar7;
  
  local_d8._M_cur =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8._M_first =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_d8._M_last =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_d8._M_node =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_90 = filter;
  local_88 = banned;
  local_80 = state;
  do {
    while( true ) {
      while( true ) {
        if (local_d8._M_cur ==
            (this->m_peers).
            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            .
            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          return;
        }
        torrent_peer::address(*local_d8._M_cur);
        uVar2 = ip_filter::access(filter,(char *)&local_b8,__type);
        if (((uVar2 & 1) != 0) && (*local_d8._M_cur != this->m_locked_peer)) break;
        local_d8._M_cur = local_d8._M_cur + 1;
        if (local_d8._M_cur == local_d8._M_last) {
          local_d8._M_cur = local_d8._M_node[1];
          local_d8._M_last = local_d8._M_cur + 0x40;
          local_d8._M_first = local_d8._M_cur;
          local_d8._M_node = local_d8._M_node + 1;
        }
      }
      local_b8._M_cur =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_b8._M_first =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_b8._M_last =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_b8._M_node =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      dVar5 = ::std::operator-(&local_d8,&local_b8);
      if ((*local_d8._M_cur)->connection != (peer_connection_interface *)0x0) break;
LAB_002585a3:
      local_50._M_cur = local_d8._M_cur;
      local_50._M_first = local_d8._M_first;
      local_50._M_last = local_d8._M_last;
      local_50._M_node = local_d8._M_node;
      erase_peer(this,&local_50,local_80);
      local_78._M_cur =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_78._M_first =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_78._M_last =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_78._M_node =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      ::std::operator+(&local_b8,&local_78,(long)(int)dVar5);
      local_d8._M_last = local_b8._M_last;
      local_d8._M_node = local_b8._M_node;
      local_d8._M_cur = local_b8._M_cur;
      local_d8._M_first = local_b8._M_first;
    }
    sVar6 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    ppVar1 = (*local_d8._M_cur)->connection;
    iVar3 = (*ppVar1->_vptr_peer_connection_interface[2])(ppVar1);
    psVar7 = (short *)CONCAT44(extraout_var,iVar3);
    if (*psVar7 != 2) {
      local_b8._M_first = *(_Elt_pointer *)(psVar7 + 4);
      local_b8._M_last = *(_Elt_pointer *)(psVar7 + 8);
      local_b8._M_node = (_Map_pointer)(ulong)*(uint *)(psVar7 + 0xc);
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined4 *)(psVar7 + 2);
      local_b8._M_first = (_Elt_pointer)0x0;
      local_b8._M_last = (_Elt_pointer)0x0;
      local_b8._M_node = (_Map_pointer)0x0;
    }
    local_b8._M_cur = (_Elt_pointer)CONCAT44(uVar4,(uint)(*psVar7 != 2));
    ::std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::
    emplace_back<boost::asio::ip::address>(local_88,(address *)&local_b8);
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&local_b8,banned_by_ip_filter,(type *)0x0);
    (*ppVar1->_vptr_peer_connection_interface[4])(ppVar1,&local_b8,1,0);
    sVar8 = ::std::
            deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    *)this);
    filter = local_90;
    if (sVar6 <= sVar8) goto LAB_002585a3;
    local_78._M_cur =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_78._M_first =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_78._M_last =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_78._M_node =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    ::std::operator+(&local_b8,&local_78,(long)(int)dVar5);
    local_d8._M_last = local_b8._M_last;
    local_d8._M_node = local_b8._M_node;
    local_d8._M_cur = local_b8._M_cur;
    local_d8._M_first = local_b8._M_first;
    filter = local_90;
  } while( true );
}

Assistant:

void peer_list::apply_ip_filter(ip_filter const& filter
		, torrent_state* state, std::vector<address>& banned)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		for (auto i = m_peers.begin(); i != m_peers.end();)
		{
			if ((filter.access((*i)->address()) & ip_filter::blocked) == 0)
			{
				++i;
				continue;
			}
			if (*i == m_locked_peer)
			{
				++i;
				continue;
			}

			int const current = int(i - m_peers.begin());
			TORRENT_ASSERT(current >= 0);
			TORRENT_ASSERT(m_peers.size() > 0);
			TORRENT_ASSERT(i != m_peers.end());

			if ((*i)->connection)
			{
				// disconnecting the peer here may also delete the
				// peer_info_struct. If that is the case, just continue
				size_t count = m_peers.size();
				peer_connection_interface* p = (*i)->connection;

				banned.push_back(p->remote().address());

				p->disconnect(errors::banned_by_ip_filter
					, operation_t::bittorrent);

				// what *i refers to has changed, i.e. cur was deleted
				if (m_peers.size() < count)
				{
					i = m_peers.begin() + current;
					continue;
				}
				TORRENT_ASSERT((*i)->connection == nullptr
					|| (*i)->connection->peer_info_struct() == nullptr);
			}

			erase_peer(i, state);
			i = m_peers.begin() + current;
		}
	}